

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O1

void __thiscall Assimp::AMFImporter::ParseNode_Instance(AMFImporter *this)

{
  size_t *psVar1;
  CAMFImporter_NodeElement *pCVar2;
  _Base_ptr p_Var3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CAMFImporter_NodeElement *pCVar6;
  _List_node_base *p_Var7;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  undefined8 extraout_RAX_03;
  runtime_error *this_00;
  undefined8 extraout_RAX_04;
  AMFImporter *this_01;
  pointer pcVar8;
  uint uVar9;
  ulong uVar10;
  char *__end;
  float fVar11;
  string an;
  string objectid;
  undefined1 local_b0 [32];
  _Base_ptr local_90;
  _Base_ptr local_88;
  undefined1 local_80 [16];
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  uint local_40;
  uint local_3c;
  CAMFImporter_NodeElement *local_38;
  
  local_90 = (_Base_ptr)local_80;
  local_88 = (_Base_ptr)0x0;
  local_80[0] = _S_red;
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  if (0 < (int)uVar4) {
    uVar10 = 0;
    do {
      pcVar8 = local_b0 + 0x10;
      iVar5 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,uVar10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_b0,(char *)CONCAT44(extraout_var,iVar5),
                 (allocator<char> *)(local_80 + 0x10));
      iVar5 = std::__cxx11::string::compare((char *)local_b0);
      if (iVar5 != 0) goto LAB_003c9734;
      iVar5 = (*this->mReader->_vptr_IIrrXMLReader[6])();
      p_Var3 = local_88;
      strlen((char *)CONCAT44(extraout_var_00,iVar5));
      std::__cxx11::string::_M_replace
                ((ulong)&local_90,0,(char *)p_Var3,CONCAT44(extraout_var_00,iVar5));
      if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
    } while (uVar4 != uVar9);
  }
  pcVar8 = local_b0 + 0x10;
  if (local_88 == (_Base_ptr)0x0) {
LAB_003c9741:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_b0._0_8_ = pcVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"\"objectid\" in <instance> must be defined.","");
    std::runtime_error::runtime_error(this_00,(string *)local_b0);
    *(undefined ***)this_00 = &PTR__runtime_error_008e3168;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pCVar6 = (CAMFImporter_NodeElement *)operator_new(0x88);
  pCVar2 = this->mNodeElement_Cur;
  pCVar6->Type = 4;
  (pCVar6->ID)._M_dataplus._M_p = (pointer)&(pCVar6->ID).field_2;
  (pCVar6->ID)._M_string_length = 0;
  (pCVar6->ID).field_2._M_local_buf[0] = '\0';
  pCVar6->Parent = pCVar2;
  (pCVar6->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (pCVar6->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (pCVar6->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&pCVar6->Child;
  (pCVar6->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&pCVar6->Child;
  (pCVar6->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  pCVar6->_vptr_CAMFImporter_NodeElement =
       (_func_int **)&PTR__CAMFImporter_NodeElement_Instance_008ecde0;
  pCVar6[1]._vptr_CAMFImporter_NodeElement = (_func_int **)&pCVar6[1].ID;
  *(_List_node_base **)&pCVar6[1].Type = (_List_node_base *)0x0;
  *(undefined1 *)&pCVar6[1].ID._M_dataplus._M_p = 0;
  pCVar6[1].ID.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pCVar6[1].ID.field_2 + 8) = 0;
  pCVar6[1].Parent = (CAMFImporter_NodeElement *)0x0;
  std::__cxx11::string::_M_assign((string *)(pCVar6 + 1));
  iVar5 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar5 == '\0') {
    local_38 = (CAMFImporter_NodeElement *)&pCVar6[1].ID.field_2;
    *(size_type *)local_38 = 0;
    *(undefined8 *)((long)&pCVar6[1].ID.field_2 + 8) = 0;
    pCVar6[1].Parent = (CAMFImporter_NodeElement *)0x0;
    pCVar2 = this->mNodeElement_Cur;
    p_Var7 = (_List_node_base *)operator_new(0x18);
    p_Var7[1]._M_next = (_List_node_base *)pCVar6;
    std::__detail::_List_node_base::_M_hook(p_Var7);
    psVar1 = &(pCVar2->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    this->mNodeElement_Cur = pCVar6;
    local_3c = 0;
    local_40 = 0;
    local_50._12_4_ = 0;
    local_50._8_4_ = 0;
    local_50._M_allocated_capacity._4_4_ = 0;
    local_50._M_allocated_capacity._0_4_ = 0;
LAB_003c9284:
    do {
      do {
        uVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        pcVar8 = (pointer)(ulong)uVar4;
        if ((char)uVar4 == '\0') goto LAB_003c970a;
        iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar5 == 1) {
          pcVar8 = local_b0 + 0x10;
          local_b0._0_8_ = pcVar8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"deltax","");
          (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar5 = std::__cxx11::string::compare((char *)local_b0);
          if ((pointer)local_b0._0_8_ != pcVar8) {
            operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
          }
          if (iVar5 == 0) {
            if ((local_3c & 1) == 0) {
              fVar11 = XML_ReadNode_GetVal_AsFloat(this);
              *(float *)&local_38->_vptr_CAMFImporter_NodeElement = fVar11;
              local_3c = (uint)CONCAT71((int7)((ulong)local_38 >> 8),1);
              goto LAB_003c9284;
            }
            local_b0._0_8_ = pcVar8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"deltax","");
            local_70._0_8_ = local_70 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_80 + 0x10),"Only one component can be defined.","");
            Throw_MoreThanOnceDefined(this,(string *)local_b0,(string *)(local_80 + 0x10));
LAB_003c97e9:
            local_b0._0_8_ = pcVar8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"deltay","");
            local_70._0_8_ = local_70 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_80 + 0x10),"Only one component can be defined.","");
            Throw_MoreThanOnceDefined(this,(string *)local_b0,(string *)(local_80 + 0x10));
LAB_003c9837:
            local_b0._0_8_ = pcVar8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"deltaz","");
            local_70._0_8_ = local_70 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_80 + 0x10),"Only one component can be defined.","");
            Throw_MoreThanOnceDefined(this,(string *)local_b0,(string *)(local_80 + 0x10));
LAB_003c9885:
            local_b0._0_8_ = pcVar8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"rx","");
            local_70._0_8_ = local_70 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_80 + 0x10),"Only one component can be defined.","");
            Throw_MoreThanOnceDefined(this,(string *)local_b0,(string *)(local_80 + 0x10));
          }
          else {
            local_b0._0_8_ = pcVar8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"deltay","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar5 = std::__cxx11::string::compare((char *)local_b0);
            if ((pointer)local_b0._0_8_ != pcVar8) {
              operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
            }
            if (iVar5 == 0) {
              if ((local_40 & 1) != 0) goto LAB_003c97e9;
              fVar11 = XML_ReadNode_GetVal_AsFloat(this);
              *(float *)((long)&pCVar6[1].ID.field_2 + 4) = fVar11;
              local_40 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
              goto LAB_003c9284;
            }
            local_b0._0_8_ = pcVar8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"deltaz","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar5 = std::__cxx11::string::compare((char *)local_b0);
            if ((pointer)local_b0._0_8_ != pcVar8) {
              operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
            }
            if (iVar5 == 0) {
              if ((local_50._12_4_ & 1) != 0) goto LAB_003c9837;
              fVar11 = XML_ReadNode_GetVal_AsFloat(this);
              *(float *)((long)&pCVar6[1].ID.field_2 + 8) = fVar11;
              local_50._12_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
              goto LAB_003c9284;
            }
            local_b0._0_8_ = pcVar8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"rx","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar5 = std::__cxx11::string::compare((char *)local_b0);
            if ((pointer)local_b0._0_8_ != pcVar8) {
              operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
            }
            if (iVar5 == 0) {
              if ((local_50._8_4_ & 1) != 0) goto LAB_003c9885;
              fVar11 = XML_ReadNode_GetVal_AsFloat(this);
              *(float *)((long)&pCVar6[1].ID.field_2 + 0xc) = fVar11;
              local_50._8_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
              goto LAB_003c9284;
            }
            local_b0._0_8_ = pcVar8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"ry","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar5 = std::__cxx11::string::compare((char *)local_b0);
            if ((pointer)local_b0._0_8_ != pcVar8) {
              operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
            }
            if (iVar5 != 0) {
              local_b0._0_8_ = pcVar8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"rz","");
              (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar5 = std::__cxx11::string::compare((char *)local_b0);
              if ((pointer)local_b0._0_8_ != pcVar8) {
                operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
              }
              if (iVar5 == 0) {
                if ((local_50._M_allocated_capacity._0_4_ & 1) != 0) goto LAB_003c9921;
                fVar11 = XML_ReadNode_GetVal_AsFloat(this);
                *(float *)((long)&pCVar6[1].Parent + 4) = fVar11;
                local_50._M_allocated_capacity._0_4_ =
                     (undefined4)CONCAT71((int7)((ulong)extraout_RAX_03 >> 8),1);
              }
              else {
                local_b0._0_8_ = pcVar8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"instance","");
                XML_CheckNode_SkipUnsupported(this,(string *)local_b0);
                if ((pointer)local_b0._0_8_ != pcVar8) {
                  operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
                }
              }
              goto LAB_003c9284;
            }
            if ((local_50._M_allocated_capacity._4_4_ & 1) == 0) {
              fVar11 = XML_ReadNode_GetVal_AsFloat(this);
              *(float *)&pCVar6[1].Parent = fVar11;
              local_50._M_allocated_capacity._4_4_ =
                   (undefined4)CONCAT71((int7)((ulong)extraout_RAX_02 >> 8),1);
              goto LAB_003c9284;
            }
          }
          local_b0._0_8_ = pcVar8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"ry","");
          local_70._0_8_ = local_70 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_80 + 0x10),"Only one component can be defined.","");
          Throw_MoreThanOnceDefined(this,(string *)local_b0,(string *)(local_80 + 0x10));
LAB_003c9921:
          local_b0._0_8_ = pcVar8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"rz","");
          local_70._0_8_ = local_70 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_80 + 0x10),"Only one component can be defined.","");
          Throw_MoreThanOnceDefined(this,(string *)local_b0,(string *)(local_80 + 0x10));
          if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
            operator_delete((void *)local_70._0_8_,(ulong)(local_70._16_8_ + 1));
          }
          if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
            operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
          }
          if (local_90 != (_Base_ptr)local_80) {
            operator_delete(local_90,CONCAT71(local_80._1_7_,local_80[0]) + 1);
          }
          _Unwind_Resume(extraout_RAX_04);
        }
        iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar5 != 2);
      local_b0._0_8_ = local_b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"instance","");
      (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar5 = std::__cxx11::string::compare((char *)local_b0);
      if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
    } while (iVar5 != 0);
    if ((char)uVar4 == '\0') {
LAB_003c970a:
      this_01 = (AMFImporter *)local_b0;
      local_b0._0_8_ = local_b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)this_01,"instance","");
      Throw_CloseNotFound(this_01,(string *)local_b0);
LAB_003c9734:
      Throw_IncorrectAttr(this,(string *)local_b0);
      goto LAB_003c9741;
    }
    if (this->mNodeElement_Cur != (CAMFImporter_NodeElement *)0x0) {
      this->mNodeElement_Cur = this->mNodeElement_Cur->Parent;
    }
    *(float *)((long)&pCVar6[1].ID.field_2 + 0xc) =
         (*(float *)((long)&pCVar6[1].ID.field_2 + 0xc) * 3.1415927) / 180.0;
    *(float *)&pCVar6[1].Parent = (*(float *)&pCVar6[1].Parent * 3.1415927) / 180.0;
    *(float *)((long)&pCVar6[1].Parent + 4) =
         (*(float *)((long)&pCVar6[1].Parent + 4) * 3.1415927) / 180.0;
  }
  else {
    pCVar2 = this->mNodeElement_Cur;
    p_Var7 = (_List_node_base *)operator_new(0x18);
    p_Var7[1]._M_next = (_List_node_base *)pCVar6;
    std::__detail::_List_node_base::_M_hook(p_Var7);
    psVar1 = &(pCVar2->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = (_List_node_base *)pCVar6;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  psVar1 = &(this->mNodeElement_List).
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_90 != (_Base_ptr)local_80) {
    operator_delete(local_90,CONCAT71(local_80._1_7_,local_80[0]) + 1);
  }
  return;
}

Assistant:

void AMFImporter::ParseNode_Instance()
{
    std::string objectid;
    CAMFImporter_NodeElement* ne( nullptr );

	// Read attributes for node <constellation>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("objectid", objectid, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;

	// used object id must be defined, check that.
	if(objectid.empty()) throw DeadlyImportError("\"objectid\" in <instance> must be defined.");
	// create and define new grouping object.
	ne = new CAMFImporter_NodeElement_Instance(mNodeElement_Cur);

	CAMFImporter_NodeElement_Instance& als = *((CAMFImporter_NodeElement_Instance*)ne);// alias for convenience

	als.ObjectID = objectid;
	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool read_flag[6] = { false, false, false, false, false, false };

		als.Delta.Set(0, 0, 0);
		als.Rotation.Set(0, 0, 0);
		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("instance");
			MACRO_NODECHECK_READCOMP_F("deltax", read_flag[0], als.Delta.x);
			MACRO_NODECHECK_READCOMP_F("deltay", read_flag[1], als.Delta.y);
			MACRO_NODECHECK_READCOMP_F("deltaz", read_flag[2], als.Delta.z);
			MACRO_NODECHECK_READCOMP_F("rx", read_flag[3], als.Rotation.x);
			MACRO_NODECHECK_READCOMP_F("ry", read_flag[4], als.Rotation.y);
			MACRO_NODECHECK_READCOMP_F("rz", read_flag[5], als.Rotation.z);
		MACRO_NODECHECK_LOOPEND("instance");
		ParseHelper_Node_Exit();
		// also convert degrees to radians.
		als.Rotation.x = AI_MATH_PI_F * als.Rotation.x / 180.0f;
		als.Rotation.y = AI_MATH_PI_F * als.Rotation.y / 180.0f;
		als.Rotation.z = AI_MATH_PI_F * als.Rotation.z / 180.0f;
	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}